

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void P_SetSafeFlash(AWeapon *weapon,player_t *player,FState *flashstate,int index)

{
  int iVar1;
  undefined4 extraout_var;
  PClassActor *pPVar2;
  DPSprite *pDVar3;
  PClass *pPVar4;
  FState *pFVar5;
  bool bVar6;
  
  if (flashstate != (FState *)0x0) {
    if ((weapon->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
        Class == (PClass *)0x0) {
      iVar1 = (**(weapon->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                 super_DObject._vptr_DObject)(weapon);
      (weapon->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
      Class = (PClass *)CONCAT44(extraout_var,iVar1);
    }
    for (pPVar4 = (weapon->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                  super_DObject.Class; bVar6 = pPVar4 != AWeapon::RegistrationInfo.MyClass, bVar6;
        pPVar4 = pPVar4->ParentClass) {
      pFVar5 = *(FState **)
                &pPVar4[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
                 super_PType.super_PTypeBase.super_DObject;
      if ((pFVar5 <= flashstate) &&
         (pFVar5 = pFVar5 + *(int *)&pPVar4[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                     super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
                                     GCNext, flashstate < pFVar5)) {
        if (flashstate + index < pFVar5) {
          if (player == (player_t *)0x0) goto LAB_0043a8e3;
          pDVar3 = player_t::GetPSprite(player,PSP_FLASH);
          pFVar5 = flashstate + index;
        }
        else {
          if (player == (player_t *)0x0) goto LAB_0043a8e3;
          pDVar3 = player_t::GetPSprite(player,PSP_FLASH);
          pFVar5 = flashstate;
        }
        DPSprite::SetState(pDVar3,pFVar5,true);
        goto LAB_0043a8e3;
      }
    }
    pPVar2 = FState::StaticFindStateOwner(flashstate + index);
    if (pPVar2 == (PClassActor *)0x0) {
      index = 0;
    }
LAB_0043a8e3:
    if (bVar6) {
      return;
    }
  }
  if (player == (player_t *)0x0) {
    return;
  }
  pDVar3 = player_t::GetPSprite(player,PSP_FLASH);
  DPSprite::SetState(pDVar3,flashstate + index,true);
  return;
}

Assistant:

void P_SetSafeFlash(AWeapon *weapon, player_t *player, FState *flashstate, int index)
{
	if (flashstate != nullptr)
	{
		PClassActor *cls = weapon->GetClass();
		while (cls != RUNTIME_CLASS(AWeapon))
		{
			if (flashstate >= cls->OwnedStates && flashstate < cls->OwnedStates + cls->NumOwnedStates)
			{
				// The flash state belongs to this class.
				// Now let's check if the actually wanted state does also
				if (flashstate + index < cls->OwnedStates + cls->NumOwnedStates)
				{
					// we're ok so set the state
					P_SetPsprite(player, PSP_FLASH, flashstate + index, true);
					return;
				}
				else
				{
					// oh, no! The state is beyond the end of the state table so use the original flash state.
					P_SetPsprite(player, PSP_FLASH, flashstate, true);
					return;
				}
			}
			// try again with parent class
			cls = static_cast<PClassActor *>(cls->ParentClass);
		}
		// if we get here the state doesn't seem to belong to any class in the inheritance chain
		// This can happen with Dehacked if the flash states are remapped. 
		// The only way to check this would be to go through all Dehacked modifiable actors, convert
		// their states into a single flat array and find the correct one.
		// Rather than that, just check to make sure it belongs to something.
		if (FState::StaticFindStateOwner(flashstate + index) == NULL)
		{ // Invalid state. With no index offset, it should at least be valid.
			index = 0;
		}
	}
	P_SetPsprite(player, PSP_FLASH, flashstate + index, true);
}